

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_sourcePosition_primitive_startColumn
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint in_EAX;
  uint32_t startColumn;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uStack_18 = (ulong)(uint)uStack_18;
  sysbvm_sourceCode_computeLineAndColumnForIndex
            (context,*(sysbvm_tuple_t *)(*arguments + 0x10),*(sysbvm_tuple_t *)(*arguments + 0x18),
             (uint32_t *)0x0,(uint32_t *)((long)&uStack_18 + 4));
  return (uStack_18 >> 0x20) << 4 | 9;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourcePosition_primitive_startColumn(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)argumentCount;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_sourcePosition_t *sourcePosition = (sysbvm_sourcePosition_t*)arguments[0];
    uint32_t startColumn = 0;
    sysbvm_sourceCode_computeLineAndColumnForIndex(context, sourcePosition->sourceCode, sourcePosition->startIndex, NULL, &startColumn);
    return sysbvm_tuple_uint32_encode(context, startColumn);
}